

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_MSR_v7m(DisasContext_conflict1 *s,arg_MSR_v7m *a)

{
  int reg;
  TCGContext_conflict1 *pTVar1;
  TCGContext_conflict1 *s_00;
  TCGv_i32 pTVar2;
  TCGTemp *pTVar3;
  uint uVar4;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 var;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar4 = (uint)s->features;
  if ((uVar4 >> 9 & 1) != 0) {
    pTVar1 = s->uc->tcg_ctx;
    pTVar2 = tcg_const_i32_aarch64(pTVar1,a->mask << 10 | a->sysm);
    reg = a->rn;
    s_00 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar3 - (long)s_00);
    load_reg_var(s,var,reg);
    local_48 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
    pTVar3 = (TCGTemp *)(var + (long)pTVar1);
    local_40 = (TCGTemp *)(pTVar2 + (long)pTVar1);
    local_38 = pTVar3;
    tcg_gen_callN_aarch64(pTVar1,helper_v7m_msr_aarch64,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar2 + (long)pTVar1));
    tcg_temp_free_internal_aarch64(pTVar1,pTVar3);
    local_48 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
    tcg_gen_callN_aarch64(pTVar1,helper_rebuild_hflags_m32_newel_aarch64,(TCGTemp *)0x0,1,&local_48)
    ;
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                        (long)(int)(s->base).pc_next);
    (s->base).is_jmp = DISAS_TARGET_9;
  }
  return (_Bool)((byte)(uVar4 >> 9) & 1);
}

Assistant:

static bool trans_MSR_v7m(DisasContext *s, arg_MSR_v7m *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, reg;

    if (!arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    addr = tcg_const_i32(tcg_ctx, (a->mask << 10) | a->sysm);
    reg = load_reg(s, a->rn);
    gen_helper_v7m_msr(tcg_ctx, tcg_ctx->cpu_env, addr, reg);
    tcg_temp_free_i32(tcg_ctx, addr);
    tcg_temp_free_i32(tcg_ctx, reg);
    /* If we wrote to CONTROL, the EL might have changed */
    gen_helper_rebuild_hflags_m32_newel(tcg_ctx, tcg_ctx->cpu_env);
    gen_lookup_tb(s);
    return true;
}